

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_21(QPDF *pdf,char *arg2)

{
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  const_reference pvVar1;
  ostream *this_00;
  QPDFObjectHandle local_88 [2];
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  QPDFObjectHandle contents;
  QPDFObjectHandle page;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  pvVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &contents.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/Contents",&local_61);
  QPDFObjectHandle::getKey((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  QPDFObjectHandle::shallowCopy();
  QPDFObjectHandle::~QPDFObjectHandle(local_88);
  this_00 = std::operator<<((ostream *)&std::cout,"you can\'t see this");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &contents.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_21(QPDF& pdf, char const* arg2)
{
    // Try to shallow copy a stream
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    QPDFObjectHandle page = pages.at(0);
    QPDFObjectHandle contents = page.getKey("/Contents");
    contents.shallowCopy();
    std::cout << "you can't see this" << std::endl;
}